

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printUserSettings(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  double dVar1;
  uint32_t uVar2;
  long in_RDI;
  int i_2;
  int i_1;
  int i;
  bool printedValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  SPxOut *in_stack_ffffffffffffff00;
  string local_88 [36];
  int local_64;
  string local_60 [32];
  int local_40;
  string local_30 [32];
  int local_10;
  byte local_9;
  
  local_9 = 0;
  SPxOut::getCurrentStream(in_stack_ffffffffffffff00);
  SPxOut::setFixed((ostream *)in_stack_ffffffffffffff00,
                   (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  for (local_10 = 0; local_10 < 0x1a; local_10 = local_10 + 1) {
    if ((*(byte *)(*(long *)(in_RDI + 0x28) + (long)local_10) & 1) !=
        (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
         ::Settings::boolParam[(long)local_10 + 0x680] & 1)) {
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      std::__cxx11::string::string
                (local_30,(string *)
                          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           ::Settings::boolParam + (long)local_10 * 0x20));
      soplex::operator<<(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(local_30);
      local_9 = 1;
    }
  }
  for (local_40 = 0; local_40 < 0x1c; local_40 = local_40 + 1) {
    if (*(int *)(*(long *)(in_RDI + 0x28) + 0x1c + (long)local_40 * 4) !=
        *(int *)(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 ::Settings::intParam + (long)local_40 * 4 + 0x700)) {
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      std::__cxx11::string::string
                (local_60,(string *)
                          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           ::Settings::intParam + (long)local_40 * 0x20));
      soplex::operator<<(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(local_60);
      local_9 = 1;
    }
  }
  SPxOut::getCurrentStream(in_stack_ffffffffffffff00);
  SPxOut::setScientific
            ((ostream *)in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  for (local_64 = 0; local_64 < 0x1b; local_64 = local_64 + 1) {
    dVar1 = *(double *)(*(long *)(in_RDI + 0x28) + 0x90 + (long)local_64 * 8);
    if ((dVar1 != *(double *)
                   (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ::Settings::realParam + (long)local_64 * 8 + 0x6c0)) ||
       (NAN(dVar1) ||
        NAN(*(double *)
             (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ::Settings::realParam + (long)local_64 * 8 + 0x6c0)))) {
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      std::__cxx11::string::string
                (local_88,(string *)
                          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           ::Settings::realParam + (long)local_64 * 0x20));
      soplex::operator<<(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff00 =
           soplex::operator<<(in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(local_88);
      local_9 = 1;
    }
  }
  uVar2 = Random::getSeed((Random *)(in_RDI + 0x14e8));
  if (uVar2 != 0) {
    in_stack_fffffffffffffef8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    Random::getSeed((Random *)(in_RDI + 0x14e8));
    soplex::operator<<(in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
    local_9 = 1;
  }
  if ((local_9 & 1) != 0) {
    soplex::operator<<(in_stack_ffffffffffffff00,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
  }
  return;
}

Assistant:

void SoPlexBase<R>::printUserSettings()
{
   bool printedValue = false;

   SPxOut::setFixed(spxout.getCurrentStream());

   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
   {
      if(_currentSettings->_boolParamValues[i] == _currentSettings->boolParam.defaultValue[i])
         continue;

      spxout << "bool:" << _currentSettings->boolParam.name[i] << " = " <<
             (_currentSettings->_boolParamValues[i] ? "true\n" : "false\n");
      printedValue = true;
   }

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
   {
      if(_currentSettings->_intParamValues[i] == _currentSettings->intParam.defaultValue[i])
         continue;

      spxout << "int:" << _currentSettings->intParam.name[i] << " = " <<
             _currentSettings->_intParamValues[i] << "\n";
      printedValue = true;
   }

   SPxOut::setScientific(spxout.getCurrentStream());

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
   {
      if(_currentSettings->_realParamValues[i] == _currentSettings->realParam.defaultValue[i])
         continue;

      spxout << "real:" << _currentSettings->realParam.name[i] << " = " <<
             _currentSettings->_realParamValues[i] << "\n";
      printedValue = true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
   {
      if(_currentSettings->_rationalParamValues[i] == _currentSettings->rationalParam.defaultValue[i])
         continue;

      spxout << "rational:" << _currentSettings->rationalParam.name[i] << " = " <<
             _currentSettings->_rationalParamValues[i] << "\n";
      printedValue = true;
   }

#endif

   if(_solver.random.getSeed() != SOPLEX_DEFAULT_RANDOM_SEED)
   {
      spxout << "uint:random_seed = " << _solver.random.getSeed() << "\n";
      printedValue = true;
   }

   if(printedValue)
      spxout << std::endl;
}